

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_hlsl_set_resource_binding_flags(spvc_compiler compiler,spvc_hlsl_binding_flags flags)

{
  spvc_context_s *this;
  spvc_result sVar1;
  allocator local_31;
  string local_30;
  
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    spirv_cross::CompilerHLSL::set_resource_binding_flags
              ((CompilerHLSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,flags);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_30,"HLSL function used on a non-HLSL backend.",&local_31);
    spvc_context_s::report_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_hlsl_set_resource_binding_flags(spvc_compiler compiler,
                                                          spvc_hlsl_binding_flags flags)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	hlsl.set_resource_binding_flags(flags);
	return SPVC_SUCCESS;
#else
	(void)flags;
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}